

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AggregateMarking::SetAggregateMarkingString
          (AggregateMarking *this,KINT8 *M,KUINT16 StringSize)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  KINT8 *pKStack_18;
  KUINT16 StringSize_local;
  KINT8 *M_local;
  AggregateMarking *this_local;
  
  local_1a = StringSize;
  pKStack_18 = M;
  M_local = (KINT8 *)this;
  if (0x1f < StringSize) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"SetAggregateMarkingString",&local_41);
    KException::KException(this_00,&local_40,3);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  strncpy(this->m_sAggregateMarkingString,M,(ulong)StringSize);
  this->m_sAggregateMarkingString[local_1a] = '\0';
  return;
}

Assistant:

void AggregateMarking::SetAggregateMarkingString( const KINT8 * M, KUINT16 StringSize )
{
    if( StringSize > 31 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    strncpy( m_sAggregateMarkingString, M, StringSize );

    m_sAggregateMarkingString[StringSize] = '\0';
}